

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar5
  ;
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  double *pdVar8;
  Fad<double> *pFVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  value_type vVar13;
  
  pFVar5 = (fadexpr->fadexpr_).left_;
  uVar3 = (((((pFVar5->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar4 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar4 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar4 != uVar3) {
    if (uVar4 == 0) {
      if (uVar3 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar3 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar4;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar4) {
        uVar12 = (long)(int)uVar4 << 3;
      }
      pdVar11 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar11;
    }
  }
  if (uVar4 != 0) {
    pdVar11 = (this->dx_).ptr_to_data;
    pFVar5 = (fadexpr->fadexpr_).left_;
    pFVar6 = (pFVar5->fadexpr_).left_;
    pFVar7 = (pFVar6->fadexpr_).right_;
    if (((pFVar7->dx_).num_elts == 0) || ((((pFVar5->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar4) {
        uVar12 = 0;
        do {
          vVar13 = FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>
                   ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar12);
          pdVar11[uVar12] = vVar13;
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
    }
    else if (0 < (int)uVar4) {
      pdVar8 = (pFVar7->dx_).ptr_to_data;
      pFVar9 = (pFVar5->fadexpr_).right_;
      pdVar10 = (pFVar9->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        dVar1 = (pFVar6->fadexpr_).left_.constant_;
        dVar2 = pFVar7->val_;
        pdVar11[uVar12] =
             (dVar1 / dVar2) * pdVar10[uVar12] -
             ((pdVar8[uVar12] * dVar1) / (dVar2 * dVar2)) * pFVar9->val_;
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
  }
  pFVar5 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  this->val_ = ((pFVar6->fadexpr_).left_.constant_ / ((pFVar6->fadexpr_).right_)->val_) *
               ((pFVar5->fadexpr_).right_)->val_ + (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}